

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.hxx
# Opt level: O0

void __thiscall Time::~Time(Time *this)

{
  Time *this_local;
  
  ~Time(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

virtual ~Time(){}